

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O2

Abc_Obj_t * Abc_SclPerformBufferingOne(Abc_Obj_t *pObj,int Degree,int fUseInvs,int fVerbose)

{
  void *pvVar1;
  bool bVar2;
  uint uVar3;
  Vec_Ptr_t *vNodes;
  Abc_Obj_t *pObj_00;
  void *pvVar4;
  void *pvVar5;
  Abc_Obj_t *pObj_01;
  ulong uVar6;
  char *pcVar7;
  int iVar8;
  uint uVar9;
  
  iVar8 = (pObj->vFanouts).nSize;
  if (iVar8 <= Degree) {
    __assert_fail("Abc_ObjFanoutNum(pObj) > Degree",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclBuffer.c"
                  ,0x172,"Abc_Obj_t *Abc_SclPerformBufferingOne(Abc_Obj_t *, int, int, int)");
  }
  vNodes = Vec_PtrAlloc(iVar8);
  Abc_NodeCollectFanouts(pObj,vNodes);
  if (1 < (long)vNodes->nSize) {
    qsort(vNodes->pArray,(long)vNodes->nSize,8,Abc_NodeCompareLevels);
  }
  if (fUseInvs == 0) {
    pObj_00 = Abc_NtkCreateNodeBuf(pObj->pNtk,(Abc_Obj_t *)0x0);
  }
  else {
    pObj_00 = Abc_NtkCreateNodeInv(pObj->pNtk,(Abc_Obj_t *)0x0);
  }
  if (Degree * 2 <= vNodes->nSize) goto LAB_0035e452;
  pvVar4 = Vec_PtrEntry(vNodes,vNodes->nSize + ~Degree);
  pvVar5 = Vec_PtrEntry(vNodes,Degree + -1);
  uVar6 = (ulong)vNodes->nSize;
  if ((long)uVar6 < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                  ,0x1b7,"void *Vec_PtrEntryLast(Vec_Ptr_t *)");
  }
  pvVar1 = vNodes->pArray[uVar6 - 1];
  uVar3 = *(uint *)((long)pvVar5 + 0x14) >> 0xc;
  if ((uVar3 == *(uint *)((long)pvVar1 + 0x14) >> 0xc) &&
     (*(uint *)((long)pvVar4 + 0x14) >> 0xc < uVar3)) {
    for (uVar3 = 0; (int)uVar3 < (int)uVar6; uVar3 = uVar3 + 1) {
      pvVar4 = Vec_PtrEntry(vNodes,uVar3);
      uVar6 = (ulong)(uint)vNodes->nSize;
      if ((*(uint *)((long)pvVar1 + 0x14) ^ *(uint *)((long)pvVar4 + 0x14)) < 0x1000) break;
    }
    if ((int)uVar6 <= (int)uVar3) {
      __assert_fail("i < Vec_PtrSize(vFanouts)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclBuffer.c"
                    ,0x189,"Abc_Obj_t *Abc_SclPerformBufferingOne(Abc_Obj_t *, int, int, int)");
    }
    if (uVar3 < 2) {
      uVar3 = Degree;
    }
    if (uVar3 == Degree) goto LAB_0035e415;
  }
  else {
LAB_0035e415:
    uVar3 = (uint)uVar6;
    if (Degree <= (int)(uVar3 - Degree)) goto LAB_0035e452;
    uVar3 = (uVar3 & 1) +
            (int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) / 2);
  }
  bVar2 = Degree < (int)uVar3;
  Degree = uVar3;
  if (bVar2) {
    __assert_fail("Degree <= Degree0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclBuffer.c"
                  ,400,"Abc_Obj_t *Abc_SclPerformBufferingOne(Abc_Obj_t *, int, int, int)");
  }
LAB_0035e452:
  uVar3 = 0;
  uVar9 = 0;
  if (0 < Degree) {
    uVar3 = 0;
    uVar9 = Degree;
  }
  for (; uVar9 != uVar3; uVar3 = uVar3 + 1) {
    pObj_01 = (Abc_Obj_t *)Vec_PtrEntry(vNodes,uVar3);
    Abc_ObjPatchFanin(pObj_01,pObj,pObj_00);
  }
  if (fVerbose != 0) {
    printf("%5d : ",(ulong)(uint)pObj->Id);
    for (iVar8 = 0; iVar8 < vNodes->nSize; iVar8 = iVar8 + 1) {
      pvVar4 = Vec_PtrEntry(vNodes,iVar8);
      pcVar7 = "";
      if (Degree - 1U == iVar8) {
        pcVar7 = "  ";
      }
      printf("%d%s ",(ulong)(*(uint *)((long)pvVar4 + 0x14) >> 0xc),pcVar7);
    }
    putchar(10);
  }
  Vec_PtrFree(vNodes);
  Abc_ObjAddFanin(pObj_00,pObj);
  iVar8 = Abc_SclComputeReverseLevel(pObj_00);
  *(uint *)&pObj_00->field_0x14 = *(uint *)&pObj_00->field_0x14 & 0xfff | iVar8 << 0xc;
  if (fUseInvs != 0) {
    Abc_NodeInvUpdateFanPolarity(pObj_00);
  }
  return pObj_00;
}

Assistant:

Abc_Obj_t * Abc_SclPerformBufferingOne( Abc_Obj_t * pObj, int Degree, int fUseInvs, int fVerbose )
{
    Vec_Ptr_t * vFanouts;
    Abc_Obj_t * pBuffer, * pFanout;
    int i, Degree0 = Degree;
    assert( Abc_ObjFanoutNum(pObj) > Degree );
    // collect fanouts and sort by reverse level
    vFanouts = Vec_PtrAlloc( Abc_ObjFanoutNum(pObj) );
    Abc_NodeCollectFanouts( pObj, vFanouts );
    Vec_PtrSort( vFanouts, (int (*)(void))Abc_NodeCompareLevels );
    // select the first Degree fanouts
    if ( fUseInvs )
        pBuffer = Abc_NtkCreateNodeInv( pObj->pNtk, NULL );
    else
        pBuffer = Abc_NtkCreateNodeBuf( pObj->pNtk, NULL );
    // check if it is possible to not increase level
    if ( Vec_PtrSize(vFanouts) < 2 * Degree )
    {
        Abc_Obj_t * pFanPrev = (Abc_Obj_t *)Vec_PtrEntry(vFanouts, Vec_PtrSize(vFanouts)-1-Degree);
        Abc_Obj_t * pFanThis = (Abc_Obj_t *)Vec_PtrEntry(vFanouts, Degree-1);
        Abc_Obj_t * pFanLast = (Abc_Obj_t *)Vec_PtrEntryLast(vFanouts);
        if ( Abc_ObjLevel(pFanThis) == Abc_ObjLevel(pFanLast) &&
             Abc_ObjLevel(pFanPrev) <  Abc_ObjLevel(pFanThis) )
        {
            // find the first one whose level is the same as last
            Vec_PtrForEachEntry( Abc_Obj_t *, vFanouts, pFanout, i )
                if ( Abc_ObjLevel(pFanout) == Abc_ObjLevel(pFanLast) )
                    break;
            assert( i < Vec_PtrSize(vFanouts) );
            if ( i > 1 )
                Degree = i;
        }
        // make the last two more well-balanced
        if ( Degree == Degree0 && Degree > Vec_PtrSize(vFanouts) - Degree )
            Degree = Vec_PtrSize(vFanouts)/2 + (Vec_PtrSize(vFanouts) & 1);
        assert( Degree <= Degree0 );
    }
    // select fanouts
    Vec_PtrForEachEntryStop( Abc_Obj_t *, vFanouts, pFanout, i, Degree )
        Abc_ObjPatchFanin( pFanout, pObj, pBuffer );
    if ( fVerbose )
    {
        printf( "%5d : ", Abc_ObjId(pObj) );
        Vec_PtrForEachEntry( Abc_Obj_t *, vFanouts, pFanout, i )
            printf( "%d%s ", Abc_ObjLevel(pFanout), i == Degree-1 ? "  " : "" );
        printf( "\n" );
    }
    Vec_PtrFree( vFanouts );
    Abc_ObjAddFanin( pBuffer, pObj );
    pBuffer->Level = Abc_SclComputeReverseLevel( pBuffer );
    if ( fUseInvs )
        Abc_NodeInvUpdateFanPolarity( pBuffer );
    return pBuffer;
}